

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * parameter(object *fp)

{
  int iVar1;
  item *x_00;
  typeDesc *type;
  item *x;
  int cond;
  int i;
  int r;
  object *fp_local;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x1f7) {
    loadStringLiteralToHeap(x_00);
    x_00->lev = fp->lev;
    getSymbol();
  }
  else {
    simpleExpression(x_00);
  }
  iVar1 = isParameter(fp);
  if (iVar1 == 1) {
    emitParameter(x_00,fp->typeIndex,fp->cl);
    return fp->next;
  }
  mark("parameter error resulting from prototype or declaration");
  exit(-1);
}

Assistant:

object *parameter(struct object *fp) {
	variable int r; variable int i;
	variable bool cond;
	variable struct item *x;
	variable struct typeDesc *type;
	x = NULL; cond = false; type = NULL; r = 0; i = 0;
	allocMem(x);
	if (currentSymbol == SYMBOL_STRINGLITERAL) {
		loadStringLiteralToHeap(x);
		x->lev = fp->lev;
		getSymbol();
	} else {
		simpleExpression(x);
	}
	cond = isParameter(fp);
	if (cond == true) {
		emitParameter(x,fp->typeIndex,fp->cl);
		fp = fp->next;
	} else {
		mark("parameter error resulting from prototype or declaration");
		exit(-1);
	}
	return fp;
}